

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall ON_Material::AddTexture(ON_Material *this,wchar_t *filename,TYPE type)

{
  ON_Texture *pOVar1;
  int local_20;
  int ti;
  TYPE type_local;
  wchar_t *filename_local;
  ON_Material *this_local;
  
  local_20 = FindTexture(this,(wchar_t *)0x0,type,-1);
  if (local_20 < 0) {
    local_20 = ON_ClassArray<ON_Texture>::Count(&(this->m_textures).super_ON_ClassArray<ON_Texture>)
    ;
    ON_ClassArray<ON_Texture>::AppendNew(&(this->m_textures).super_ON_ClassArray<ON_Texture>);
  }
  if (-1 < local_20) {
    pOVar1 = ON_ClassArray<ON_Texture>::operator[]
                       (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_20);
    ON_FileReference::SetFullPath(&pOVar1->m_image_file_reference,filename,false);
    pOVar1 = ON_ClassArray<ON_Texture>::operator[]
                       (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_20);
    pOVar1->m_type = type;
    pOVar1 = ON_ClassArray<ON_Texture>::operator[]
                       (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_20);
    pOVar1->m_mode = modulate_texture;
    pOVar1 = ON_ClassArray<ON_Texture>::operator[]
                       (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_20);
    pOVar1->m_magfilter = linear_filter;
    pOVar1 = ON_ClassArray<ON_Texture>::operator[]
                       (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_20);
    ON_CreateUuid(&pOVar1->m_texture_id);
  }
  return local_20;
}

Assistant:

int ON_Material::AddTexture(const wchar_t* filename,ON_Texture::TYPE type)
{
  int ti = FindTexture(nullptr,type);
  if ( ti < 0 )
  {
    ti = m_textures.Count();
    m_textures.AppendNew();
  }
  if (ti >= 0 )
  {
    m_textures[ti].m_image_file_reference.SetFullPath(filename,false);
    m_textures[ti].m_type = type;
    m_textures[ti].m_mode = ON_Texture::MODE::modulate_texture;
    m_textures[ti].m_magfilter = ON_Texture::FILTER::linear_filter;
    ON_CreateUuid(m_textures[ti].m_texture_id);
  }
  return ti;
}